

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubD::ComponentCount(ON_SubD *this,Type component_type)

{
  element_type *peVar1;
  uint uVar2;
  ON_SubDLevel *pOVar3;
  undefined3 in_register_00000031;
  int iVar4;
  
  iVar4 = CONCAT31(in_register_00000031,component_type);
  if (iVar4 == 6) {
    peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (pOVar3 = peVar1->m_active_level, pOVar3 == (ON_SubDLevel *)0x0)) {
      pOVar3 = &ON_SubDLevel::Empty;
    }
    uVar2 = pOVar3->m_face_count;
  }
  else {
    if (iVar4 == 4) {
      peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((peVar1 == (element_type *)0x0) ||
         (pOVar3 = peVar1->m_active_level, pOVar3 == (ON_SubDLevel *)0x0)) {
        pOVar3 = &ON_SubDLevel::Empty;
      }
      return pOVar3->m_edge_count;
    }
    uVar2 = 0;
    if (iVar4 == 2) {
      peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((peVar1 == (element_type *)0x0) ||
         (pOVar3 = peVar1->m_active_level, pOVar3 == (ON_SubDLevel *)0x0)) {
        pOVar3 = &ON_SubDLevel::Empty;
      }
      return pOVar3->m_vertex_count;
    }
  }
  return uVar2;
}

Assistant:

unsigned ON_SubD::ComponentCount(
  ON_SubDComponentPtr::Type component_type
) const 
{
  switch (component_type)
  {
  case ON_SubDComponentPtr::Type::Vertex:
    return this->VertexCount();
    break;
  case ON_SubDComponentPtr::Type::Edge:
    return this->EdgeCount();
    break;
  case ON_SubDComponentPtr::Type::Face:
    return this->FaceCount();
    break;
  default:
    break;
  }
  return 0;
}